

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::ReservoirQuantileOperation::
     Operation<float,duckdb::ReservoirQuantileState<float>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<float> *state,float *input,AggregateUnaryInput *unary_input)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  BaseReservoirSampling *this_00;
  
  this = unary_input->input;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
  pFVar1 = (this->bind_data).ptr;
  if (state->pos == 0) {
    ReservoirQuantileState<float>::Resize(state,(idx_t)pFVar1[4]._vptr_FunctionData);
  }
  if (state->r_samp == (BaseReservoirSampling *)0x0) {
    this_00 = (BaseReservoirSampling *)operator_new(0x78);
    BaseReservoirSampling::BaseReservoirSampling(this_00);
    state->r_samp = this_00;
  }
  ReservoirQuantileState<float>::FillReservoir(state,(idx_t)pFVar1[4]._vptr_FunctionData,*input);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_data = unary_input.input.bind_data->template Cast<ReservoirQuantileBindData>();
		if (state.pos == 0) {
			state.Resize(bind_data.sample_size);
		}
		if (!state.r_samp) {
			state.r_samp = new BaseReservoirSampling();
		}
		D_ASSERT(state.v);
		state.FillReservoir(bind_data.sample_size, input);
	}